

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Bdd __thiscall
sylvan::Bdd::VariablesCube(Bdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *variables)

{
  MTBDD low;
  ulong uVar1;
  
  uVar1 = (ulong)(*(long *)(variables + 8) - *(long *)variables) >> 2 & 0xffffffff;
  low = 0x8000000000000000;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    low = mtbdd_makenode(*(uint32_t *)(*(MTBDD *)variables + (ulong)((uint)uVar1 & 0x7fffffff) * 4),
                         low,*(MTBDD *)variables);
  }
  this->bdd = low;
  mtbdd_protect(&this->bdd);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::VariablesCube(std::vector<uint32_t> variables)
{
    BDD result = sylvan_true;
    for (int i=variables.size()-1; i>=0; i--) {
        result = sylvan_makenode(variables[i], sylvan_false, result);
    }
    return result;
}